

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void * normal_operator_new_array(size_t size)

{
  void *pvVar1;
  undefined8 *puVar2;
  
  pvVar1 = (*PlatformSpecificMalloc)(size);
  if (pvVar1 != (void *)0x0) {
    return pvVar1;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = srand;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

UT_THROW(std::bad_alloc)
{
    void* memory = PlatformSpecificMalloc(size);
    UT_THROW_BAD_ALLOC_WHEN_NULL(memory);
    return memory;
}